

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createConstants.cpp
# Opt level: O1

void createConstantsForOperands(User *ins,Program *program)

{
  User *ins_00;
  Value *pVVar1;
  Expr *pEVar2;
  Value *val;
  Use *op;
  Use *pUVar3;
  const_op_range cVar4;
  
  cVar4 = llvm::User::operands(ins);
  for (pUVar3 = cVar4.begin_iterator; pUVar3 != cVar4.end_iterator; pUVar3 = pUVar3 + 0x20) {
    ins_00 = *(User **)pUVar3;
    if (ins_00[0x10] != (User)0x3) {
      if ((ins_00 != (User *)0x0 && 6 < (byte)((char)ins_00[0x10] - 0x14U)) &&
         ((byte)ins_00[0x10] < 0x1b)) {
        createConstantsForOperands(ins_00,program);
      }
      pVVar1 = *(Value **)pUVar3;
      if ((pVVar1 == (Value *)0x0) || (val = pVVar1, 0x13 < (byte)pVVar1[0x10])) {
        val = (Value *)0x0;
      }
      if ((val != (Value *)0x0) &&
         (pEVar2 = Program::getExpr(program,pVVar1), pEVar2 == (Expr *)0x0)) {
        pVVar1 = *(Value **)pUVar3;
        pEVar2 = createConstantValue(val,program);
        Program::addExpr(program,pVVar1,pEVar2);
      }
    }
  }
  return;
}

Assistant:

static void createConstantsForOperands(const llvm::User* ins, Program& program) {
    for (const auto& op : ins->operands()) {

        // assumption: the GV that is an operand of this has already been initialized
        // reason: pass ComputeGlobalVarsOrder has been completed
        if (llvm::isa<llvm::GlobalVariable>(op.get()))
            continue;

        if (auto *user = llvm::dyn_cast_or_null<llvm::User>(op.get())) {
            if (!llvm::isa<llvm::Instruction>(user))
                createConstantsForOperands(user, program);
        }

        if (auto C = llvm::dyn_cast_or_null<llvm::Constant>(op.get())) {
            if (program.getExpr(op.get()) == nullptr)
                program.addExpr(op.get(), createConstantValue(C, program));
        }

    }
}